

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

bool __thiscall ON_SubDHeap::GrowVertexFaceArray(ON_SubDHeap *this,ON_SubDVertex *v,size_t capacity)

{
  ON_SubDFace **ppOVar1;
  ulong local_18;
  
  local_18 = capacity;
  if (v != (ON_SubDVertex *)0x0) {
    if (capacity == 0) {
      local_18 = (ulong)v->m_face_count + 1;
    }
    if (local_18 <= v->m_face_capacity) {
      return true;
    }
    ppOVar1 = (ON_SubDFace **)
              ResizeArray(this,(ulong)v->m_face_count,(ulong)v->m_face_capacity,
                          (ON__UINT_PTR *)v->m_faces,&local_18);
    if (ppOVar1 != (ON_SubDFace **)0x0) {
      v->m_faces = ppOVar1;
      v->m_face_capacity = (unsigned_short)local_18;
      return true;
    }
    v->m_face_count = 0;
    v->m_face_capacity = 0;
    v->m_faces = (ON_SubDFace **)0x0;
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

bool ON_SubDHeap::GrowVertexFaceArray(
  ON_SubDVertex* v,
  size_t capacity
  )
{
  if ( nullptr == v)
    return ON_SUBD_RETURN_ERROR(false);
  if ( 0 == capacity )
    capacity = v->m_face_count+1;
  if ( capacity <= v->m_face_capacity)
    return true;
  ON__UINT_PTR* a = ResizeArray(v->m_face_count,v->m_face_capacity,(ON__UINT_PTR*)v->m_faces,&capacity);
  if (nullptr == a)
  {
    v->m_face_count = 0;
    v->m_face_capacity = 0;
    v->m_faces = nullptr;
    return ON_SUBD_RETURN_ERROR(false);
  }
  v->m_faces = (const ON_SubDFace**)a;
  v->m_face_capacity = (unsigned short)capacity;
  return true;
}